

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugNames::NameIndex::dumpEntry(NameIndex *this,ScopedPrinter *W,uint64_t *Offset)

{
  bool bVar1;
  pointer this_00;
  Twine local_1a0;
  Twine local_188;
  Twine local_170;
  string local_158;
  StringRef local_138;
  DelimitedScope<___,____> local_128;
  DictScope EntryScope;
  anon_class_8_1_54a397f7 local_118;
  anon_class_1_0_00000001 local_109;
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  uint64_t EntryId;
  uint64_t *Offset_local;
  ScopedPrinter *W_local;
  NameIndex *this_local;
  
  EntryOr._184_8_ = *Offset;
  getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_f0,this,Offset);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_f0);
  if (bVar1) {
    Twine::Twine(&local_188,"Entry @ 0x");
    Twine::utohexstr(&local_1a0,(uint64_t *)&EntryOr.field_0xb8);
    llvm::operator+(&local_170,&local_188,&local_1a0);
    Twine::str_abi_cxx11_(&local_158,&local_170);
    StringRef::StringRef(&local_138,&local_158);
    DelimitedScope<'{',_'}'>::DelimitedScope(&local_128,W,local_138);
    std::__cxx11::string::~string((string *)&local_158);
    this_00 = Expected<llvm::DWARFDebugNames::Entry>::operator->
                        ((Expected<llvm::DWARFDebugNames::Entry> *)local_f0);
    DWARFDebugNames::Entry::dump(this_00,W);
    EntryScope.W._4_4_ = 1;
    DelimitedScope<'{',_'}'>::~DelimitedScope(&local_128);
  }
  else {
    Expected<llvm::DWARFDebugNames::Entry>::takeError
              ((Expected<llvm::DWARFDebugNames::Entry> *)local_108);
    local_118.W = W;
    handleAllErrors<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
              ((Error *)local_108,&local_109,&local_118);
    Error::~Error((Error *)local_108);
    EntryScope.W._4_4_ = 1;
  }
  Expected<llvm::DWARFDebugNames::Entry>::~Expected
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_f0);
  return bVar1;
}

Assistant:

bool DWARFDebugNames::NameIndex::dumpEntry(ScopedPrinter &W,
                                           uint64_t *Offset) const {
  uint64_t EntryId = *Offset;
  auto EntryOr = getEntry(Offset);
  if (!EntryOr) {
    handleAllErrors(EntryOr.takeError(), [](const SentinelError &) {},
                    [&W](const ErrorInfoBase &EI) { EI.log(W.startLine()); });
    return false;
  }

  DictScope EntryScope(W, ("Entry @ 0x" + Twine::utohexstr(EntryId)).str());
  EntryOr->dump(W);
  return true;
}